

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O1

string * wabt::(anonymous_namespace)::MakeDollarName_abi_cxx11_(string_view name)

{
  size_type *psVar1;
  undefined8 *puVar2;
  ulong uVar3;
  undefined8 uVar4;
  string *in_RDI;
  string local_78;
  ulong *local_58;
  long local_50;
  ulong local_48 [2];
  string_view local_38;
  
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"$","");
  string_view::to_string_abi_cxx11_(&local_78,&local_38);
  uVar3 = 0xf;
  if (local_58 != local_48) {
    uVar3 = local_48[0];
  }
  if (uVar3 < local_78._M_string_length + local_50) {
    uVar4 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      uVar4 = local_78.field_2._M_allocated_capacity;
    }
    if (local_78._M_string_length + local_50 <= (ulong)uVar4) {
      puVar2 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,(ulong)local_58);
      goto LAB_0017b3eb;
    }
  }
  puVar2 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_58,(ulong)local_78._M_dataplus._M_p);
LAB_0017b3eb:
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  psVar1 = puVar2 + 2;
  if ((size_type *)*puVar2 == psVar1) {
    uVar4 = puVar2[3];
    (in_RDI->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&in_RDI->field_2 + 8) = uVar4;
  }
  else {
    (in_RDI->_M_dataplus)._M_p = (pointer)*puVar2;
    (in_RDI->field_2)._M_allocated_capacity = *psVar1;
  }
  in_RDI->_M_string_length = puVar2[1];
  *puVar2 = psVar1;
  puVar2[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  if (local_58 != local_48) {
    operator_delete(local_58);
  }
  return in_RDI;
}

Assistant:

static std::string MakeDollarName(string_view name) {
  return std::string("$") + name.to_string();
}